

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::rehash
          (SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U> *this)

{
  uint uVar1;
  Node *pNVar2;
  Allocator *pAVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  Node *dst;
  ulong uVar6;
  TypeBase **value;
  InplaceStr local_48;
  ModuleData *local_38;
  
  uVar1 = this->bucketCount;
  uVar6 = (ulong)uVar1;
  pNVar2 = this->data;
  this->bucketCount = uVar1 * 2;
  if (this->allocator == (Allocator *)0x0) {
    dst = (Node *)(*(code *)NULLC::alloc)(uVar1 << 6);
  }
  else {
    iVar5 = (*this->allocator->_vptr_Allocator[2])();
    dst = (Node *)CONCAT44(extraout_var,iVar5);
  }
  this->data = dst;
  NULLC::fillMemory(dst,0,(ulong)this->bucketCount << 5);
  this->count = 0;
  if (uVar6 != 0) {
    value = &pNVar2->value;
    do {
      local_48.begin = (char *)0x0;
      local_48.end = (char *)0x0;
      local_38 = (ModuleData *)0x0;
      bVar4 = InplaceStr::operator==((InplaceStr *)(value + -3),&local_48);
      if ((!bVar4) || ((ModuleData *)value[-1] != local_38)) {
        insert(this,(TypeModulePair *)(value + -3),value);
      }
      value = value + 4;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  if (pNVar2 != this->storage) {
    pAVar3 = this->allocator;
    if (pAVar3 == (Allocator *)0x0) {
      (*(code *)NULLC::dealloc)(pNVar2);
    }
    else {
      (*pAVar3->_vptr_Allocator[3])(pAVar3,pNVar2);
    }
  }
  return;
}

Assistant:

void rehash()
	{
		unsigned oldBucketCount = bucketCount;
		Node *oldData = data;

		bucketCount *= 2;

		if(allocator)
			data = (Node*)allocator->alloc(sizeof(Node) * bucketCount);
		else
			data = (Node*)NULLC::alloc(sizeof(Node) * bucketCount);

		NULLC::fillMemory(data, 0, sizeof(Node) * bucketCount);

		count = 0;

		for(unsigned i = 0; i < oldBucketCount; i++)
		{
			Node &item = oldData[i];

			if(item.key == Key())
				continue;

			insert(item.key, item.value);
		}

		if(oldData != storage)
		{
			if(allocator)
				allocator->dealloc(oldData);
			else
				NULLC::dealloc(oldData);
		}
	}